

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _utils.c
# Opt level: O0

longlong bm_run_n(uint n,_func_void_varargs *test_fn)

{
  long local_40;
  timespec ts_end;
  long lStack_28;
  uint i;
  timespec ts_begin;
  _func_void_varargs *test_fn_local;
  uint n_local;
  
  ts_begin.tv_nsec = (__syscall_slong_t)test_fn;
  timespec_get(&stack0xffffffffffffffd8,1);
  for (ts_end.tv_nsec._4_4_ = 0; ts_end.tv_nsec._4_4_ < n;
      ts_end.tv_nsec._4_4_ = ts_end.tv_nsec._4_4_ + 1) {
    (*(code *)ts_begin.tv_nsec)();
  }
  timespec_get(&local_40,1);
  return (local_40 * 1000000000 + ts_end.tv_sec) - (lStack_28 * 1000000000 + ts_begin.tv_sec);
}

Assistant:

long long bm_run_n(unsigned n, void (*test_fn)()) {
    struct timespec ts_begin;
    timespec_get(&ts_begin, TIME_UTC);

    for (unsigned i = 0; i < n; i++)
        test_fn();

    struct timespec ts_end;
    timespec_get(&ts_end, TIME_UTC);

    return (ts_end.tv_sec * 1000000000 + ts_end.tv_nsec) - (ts_begin.tv_sec * 1000000000 + ts_begin.tv_nsec);
}